

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

basic_appender<char>
fmt::v11::detail::fill_n<fmt::v11::basic_appender<char>,int,char>
          (basic_appender<char> out,int count,char *value)

{
  char c;
  basic_appender<char> *this;
  basic_appender<char> local_38;
  int local_2c;
  char *pcStack_28;
  int i;
  char *value_local;
  basic_appender<char> bStack_18;
  int count_local;
  basic_appender<char> out_local;
  
  pcStack_28 = value;
  value_local._4_4_ = count;
  bStack_18.container = out.container;
  for (local_2c = 0; local_2c < value_local._4_4_; local_2c = local_2c + 1) {
    c = *pcStack_28;
    local_38 = basic_appender<char>::operator++(&stack0xffffffffffffffe8,0);
    this = basic_appender<char>::operator*(&local_38);
    basic_appender<char>::operator=(this,c);
  }
  return (basic_appender<char>)bStack_18.container;
}

Assistant:

FMT_CONSTEXPR auto fill_n(OutputIt out, Size count, const T& value)
    -> OutputIt {
  for (Size i = 0; i < count; ++i) *out++ = value;
  return out;
}